

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1785d::IDLTypeIdentifierVisitor::visit_
          (IDLTypeIdentifierVisitor *this,Array *type)

{
  Array *type_;
  int iVar1;
  UnsupportedType *this_00;
  Type *type_00;
  undefined1 auVar2 [16];
  undefined8 local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  allocator local_b1;
  string local_b0;
  undefined1 local_90 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  element_t;
  allocator local_39;
  string local_38;
  Array *local_18;
  Array *type_local;
  IDLTypeIdentifierVisitor *this_local;
  
  local_18 = type;
  type_local = (Array *)this;
  Typelib::Indirect::getIndirection();
  iVar1 = Typelib::Type::getCategory();
  if (iVar1 == 1) {
    element_t.second.field_2._M_local_buf[0xb] = '\x01';
    this_00 = (UnsupportedType *)__cxa_allocate_exception(0x38);
    type_ = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_38,"multi-dimensional arrays are not supported in IDL",&local_39);
    Typelib::UnsupportedType::UnsupportedType(this_00,(Type *)type_,&local_38);
    element_t.second.field_2._M_local_buf[0xb] = '\0';
    __cxa_throw(this_00,&Typelib::UnsupportedType::typeinfo,
                Typelib::UnsupportedType::~UnsupportedType);
  }
  type_00 = (Type *)Typelib::Indirect::getIndirection();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,"",&local_b1);
  getIDLBase((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_90,this,type_00,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::__cxx11::string::operator=((string *)&this->m_namespace,(string *)local_90);
  std::__cxx11::string::operator=
            ((string *)&this->m_front,(string *)(element_t.first.field_2._M_local_buf + 8));
  auVar2 = Typelib::Array::getDimension();
  local_120 = auVar2._0_8_;
  boost::lexical_cast<std::__cxx11::string,unsigned_long>
            (&local_118,(boost *)&local_120,auVar2._8_8_);
  std::operator+(&local_f8,"[",&local_118);
  std::operator+(&local_d8,&local_f8,"]");
  std::__cxx11::string::operator=((string *)&this->m_back,(string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_90);
  return true;
}

Assistant:

bool IDLTypeIdentifierVisitor::visit_(Array const& type)
    {
        if (type.getIndirection().getCategory() == Type::Array)
            throw UnsupportedType(type, "multi-dimensional arrays are not supported in IDL");

        pair<string, string> element_t = getIDLBase(type.getIndirection());
        m_namespace = element_t.first;
        m_front = element_t.second;
        m_back = "[" + boost::lexical_cast<string>(type.getDimension()) + "]";
        return true;
    }